

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O2

bool AnnounceKill(AActor *killer,AActor *killee)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *killer_00;
  char *from;
  char *victim;
  SoundAndString *pSVar4;
  ulong uVar5;
  bool local_439;
  char assembled [1024];
  
  uVar2 = FRandom::operator()(&pr_bbannounce);
  bVar1 = false;
  if ((cl_bbannounce.Value == true) && (bVar1 = false, deathmatch.Value != 0)) {
    local_439 = AActor::CheckLocalView(killee,consoleplayer);
    if (killer == (AActor *)0x0) {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      if (iVar3 == 0) {
        uVar5 = (ulong)((int)uVar2 % 3);
      }
      else {
        uVar5 = (ulong)(uVar2 & 1);
      }
      pSVar4 = WorldKillSounds + uVar5;
      killer_00 = (char *)0x0;
    }
    else if (killer == killee) {
      pSVar4 = (SoundAndString *)((long)&SuicideSounds[0].Message + (ulong)((uVar2 & 3) << 4));
      killer_00 = userinfo_t::GetName(&killer->player->userinfo);
    }
    else {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      pSVar4 = (SoundAndString *)
               ((long)&KillSounds[0].Message +
               (ulong)(uint)((int)((ulong)(long)(int)uVar2 % ((ulong)(iVar3 == 0) + 0x1e)) << 4));
      killer_00 = userinfo_t::GetName(&killer->player->userinfo);
      bVar1 = AActor::CheckLocalView(killer,consoleplayer);
      local_439 = local_439 || bVar1;
    }
    from = FStringTable::operator()(&GStrings,pSVar4->Message);
    bVar1 = from != (char *)0x0;
    if (bVar1) {
      iVar3 = userinfo_t::GetGender(&killee->player->userinfo);
      victim = userinfo_t::GetName(&killee->player->userinfo);
      SexMessage(from,assembled,iVar3,victim,killer_00);
      Printf(1,"%s\n",assembled);
    }
    if (local_439 != false) {
      DoVoiceAnnounce(pSVar4->Sound);
    }
  }
  return bVar1;
}

Assistant:

bool AnnounceKill (AActor *killer, AActor *killee)
{
	const char *killerName;
	const SoundAndString *choice;
	const char *message;
	int rannum = pr_bbannounce();

	if (cl_bbannounce && deathmatch)
	{
		bool playSound = killee->CheckLocalView (consoleplayer);

		if (killer == NULL)
		{ // The world killed the player
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males have scrotums to separate
				choice = &WorldKillSounds[rannum % 3];
			}
			else
			{
				choice = &WorldKillSounds[rannum & 1];
			}
			killerName = NULL;
		}
		else if (killer == killee)
		{ // The player killed self
			choice = &SuicideSounds[rannum & 3];
			killerName = killer->player->userinfo.GetName();
		}
		else
		{ // Another player did the killing
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males can be castrated
				choice = &KillSounds[rannum % countof(KillSounds)];
			}
			else
			{
				choice = &KillSounds[rannum % (countof(KillSounds) - 1)];
			}
			killerName = killer->player->userinfo.GetName();

			// Blood only plays the announcement sound on the killer's
			// computer. I think it sounds neater to also hear it on
			// the killee's machine.
			playSound |= killer->CheckLocalView (consoleplayer);
		}

		message = GStrings(choice->Message);
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killerName);
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (playSound)
		{
			DoVoiceAnnounce (choice->Sound);
		}
		return message != NULL;
	}
	return false;
}